

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFinder.cpp
# Opt level: O0

void __thiscall Saturation::LabelFinder::onNewPropositionalClause(LabelFinder *this,Clause *cl)

{
  bool bVar1;
  uint uVar2;
  Literal **ppLVar3;
  Symbol *this_00;
  Clause *in_RSI;
  Signature *in_RDI;
  uint predicate;
  uint in_stack_ffffffffffffffdc;
  
  bVar1 = Kernel::MainLoop::isRefutation((Clause *)in_RDI);
  if (((!bVar1) && (bVar1 = Kernel::Clause::noSplits((Clause *)in_RDI), bVar1)) &&
     (uVar2 = Kernel::Clause::size(in_RSI), uVar2 < 2)) {
    ppLVar3 = Kernel::Clause::operator[](in_RSI,0);
    Kernel::Term::functor(&(*ppLVar3)->super_Term);
    this_00 = Kernel::Signature::getPredicate(in_RDI,in_stack_ffffffffffffffdc);
    bVar1 = Kernel::Signature::Symbol::label(this_00);
    if (bVar1) {
      Lib::Stack<unsigned_int>::push((Stack<unsigned_int> *)in_RDI,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void LabelFinder::onNewPropositionalClause(Clause* cl)
{
  ASS(cl);
  // if we found a refutation ignore it
  if(Kernel::MainLoop::isRefutation(cl)) return;

  // Currently don't know what to do if conditional
  if(!cl->noSplits()) {
    return;
  }
  // Just looking for unit clauses
  if(cl->size() > 1){
    return;
  }

  unsigned predicate = (*cl)[0]->functor();

  // Looking for predicates
  ASS(env.signature->getPredicate(predicate));
  if(!env.signature->getPredicate(predicate)->label()){
    return;
  }

  _foundLabels.push(predicate);
}